

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-init.c
# Opt level: O0

parser_error parse_ego_item(parser *p)

{
  wchar_t tval_00;
  wchar_t sval_00;
  char *pcVar1;
  void *pvVar2;
  uint32_t *puVar3;
  object_kind *poVar4;
  ego_item *e;
  wchar_t sval;
  wchar_t tval;
  poss_item *poss;
  parser *p_local;
  
  pcVar1 = parser_getsym(p,"tval");
  tval_00 = tval_find_idx(pcVar1);
  pcVar1 = parser_getsym(p,"sval");
  sval_00 = lookup_sval(tval_00,pcVar1);
  pvVar2 = parser_priv(p);
  if (pvVar2 == (void *)0x0) {
    p_local._4_4_ = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else if (tval_00 < L'\0') {
    p_local._4_4_ = PARSE_ERROR_UNRECOGNISED_TVAL;
  }
  else if (sval_00 < L'\0') {
    p_local._4_4_ = PARSE_ERROR_UNRECOGNISED_SVAL;
  }
  else {
    puVar3 = (uint32_t *)mem_zalloc(0x10);
    poVar4 = lookup_kind(tval_00,sval_00);
    *puVar3 = poVar4->kidx;
    *(undefined8 *)(puVar3 + 2) = *(undefined8 *)((long)pvVar2 + 0x200);
    *(uint32_t **)((long)pvVar2 + 0x200) = puVar3;
    p_local._4_4_ = PARSE_ERROR_NONE;
    if (*puVar3 == 0) {
      p_local._4_4_ = PARSE_ERROR_INVALID_ITEM_NUMBER;
    }
  }
  return p_local._4_4_;
}

Assistant:

static enum parser_error parse_ego_item(struct parser *p) {
	struct poss_item *poss;
	int tval = tval_find_idx(parser_getsym(p, "tval"));
	int sval = lookup_sval(tval, parser_getsym(p, "sval"));
	struct ego_item *e = parser_priv(p);

	if (!e) {
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	}
	if (tval < 0) {
		return PARSE_ERROR_UNRECOGNISED_TVAL;
	}
	if (sval < 0) {
		return PARSE_ERROR_UNRECOGNISED_SVAL;
	}
	poss = mem_zalloc(sizeof(struct poss_item));
	poss->kidx = lookup_kind(tval, sval)->kidx;
	poss->next = e->poss_items;
	e->poss_items = poss;
	return (poss->kidx <= 0) ?
		PARSE_ERROR_INVALID_ITEM_NUMBER : PARSE_ERROR_NONE;
}